

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_esis.c
# Opt level: O0

void append(int *arr_sz,int *reserved_sz,uint32_t **arr,uint32_t val)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  undefined4 in_ECX;
  long *in_RDX;
  int *in_RSI;
  int *in_RDI;
  
  if (*in_RDI == *in_RSI) {
    *in_RSI = *in_RSI << 1;
    pvVar3 = realloc((void *)*in_RDX,(long)*in_RSI << 2);
    *in_RDX = (long)pvVar3;
  }
  lVar2 = *in_RDX;
  iVar1 = *in_RDI;
  *in_RDI = iVar1 + 1;
  *(undefined4 *)(lVar2 + (long)iVar1 * 4) = in_ECX;
  return;
}

Assistant:

static void append(int* arr_sz,
		int* reserved_sz,
		uint32_t** arr,
		uint32_t val)
{
	if (*arr_sz == *reserved_sz) {
		*reserved_sz *= 2;
		*arr = realloc(*arr,
			*reserved_sz * sizeof(**arr));
	}
	(*arr)[(*arr_sz)++] = val;
}